

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O0

WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> __thiscall
Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator++
          (WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *this,int param_1)

{
  undefined4 in_register_00000034;
  int param_1_local;
  WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *this_local;
  WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *result;
  
  WriteBarrierPtr(this,(WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)
                       CONCAT44(in_register_00000034,param_1));
  operator++((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)
             CONCAT44(in_register_00000034,param_1));
  return (WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>)(WriteBarrierPtr<void> *)this;
}

Assistant:

WriteBarrierPtr operator++(int)  // postfix ++
    {
        WriteBarrierPtr result(*this);
        ++(*this);
        return result;
    }